

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# searchinfo.h
# Opt level: O0

void __thiscall search::SearchInfo::SearchInfo(SearchInfo *this,int depth)

{
  int depth_local;
  SearchInfo *this_local;
  
  this->depth = depth;
  this->startTime = -1;
  this->stopTime = -1;
  this->nodes = -1;
  this->quit = false;
  this->stopped = false;
  return;
}

Assistant:

SearchInfo(const int depth) : depth(depth), stopTime(-1){}